

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_texture2d *
rf_gen_texture_prefilter
          (rf_texture2d *__return_storage_ptr__,rf_shader shader,rf_texture2d cubemap,rf_int size)

{
  rf_shader shader_00;
  rf_shader shader_01;
  int iVar1;
  long lVar2;
  long lVar3;
  rf_mat *prVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  rf_shader *prVar8;
  undefined1 *puVar9;
  uint i;
  int iVar10;
  rf_int mip;
  bool bVar11;
  byte bVar12;
  float fVar13;
  float fVar14;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint uVar15;
  uint extraout_XMM0_Db_01;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint uVar16;
  uint extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint uVar17;
  uint extraout_XMM0_Dd_01;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  undefined8 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffca0 [108];
  uint rbo;
  uint fbo;
  float local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  float local_248;
  uint uStack_244;
  rf_mat fbo_views [6];
  rf_mat fbo_projection;
  rf_float16 buffer;
  
  bVar12 = 0;
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  prVar8 = &shader;
  puVar9 = &stack0xfffffffffffffc88;
  for (lVar2 = 0x84; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar9 = (char)prVar8->id;
    prVar8 = (rf_shader *)((long)&prVar8->id + 1);
    puVar9 = puVar9 + 1;
  }
  shader_00.locs[0] = in_stack_fffffffffffffc8c;
  shader_00.id = in_stack_fffffffffffffc88;
  shader_00.locs[1] = in_stack_fffffffffffffc90;
  shader_00.locs[2] = in_stack_fffffffffffffc94;
  shader_00.locs[3] = (int)in_stack_fffffffffffffc98;
  shader_00.locs[4] = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  shader_00.locs[5] = in_stack_fffffffffffffca0._0_4_;
  shader_00.locs[6] = in_stack_fffffffffffffca0._4_4_;
  shader_00.locs[7] = in_stack_fffffffffffffca0._8_4_;
  shader_00.locs[8] = in_stack_fffffffffffffca0._12_4_;
  shader_00.locs[9] = in_stack_fffffffffffffca0._16_4_;
  shader_00.locs[10] = in_stack_fffffffffffffca0._20_4_;
  shader_00.locs[0xb] = in_stack_fffffffffffffca0._24_4_;
  shader_00.locs[0xc] = in_stack_fffffffffffffca0._28_4_;
  shader_00.locs[0xd] = in_stack_fffffffffffffca0._32_4_;
  shader_00.locs[0xe] = in_stack_fffffffffffffca0._36_4_;
  shader_00.locs[0xf] = in_stack_fffffffffffffca0._40_4_;
  shader_00.locs[0x10] = in_stack_fffffffffffffca0._44_4_;
  shader_00.locs[0x11] = in_stack_fffffffffffffca0._48_4_;
  shader_00.locs[0x12] = in_stack_fffffffffffffca0._52_4_;
  shader_00.locs[0x13] = in_stack_fffffffffffffca0._56_4_;
  shader_00.locs[0x14] = in_stack_fffffffffffffca0._60_4_;
  shader_00.locs[0x15] = in_stack_fffffffffffffca0._64_4_;
  shader_00.locs[0x16] = in_stack_fffffffffffffca0._68_4_;
  shader_00.locs[0x17] = in_stack_fffffffffffffca0._72_4_;
  shader_00.locs[0x18] = in_stack_fffffffffffffca0._76_4_;
  shader_00.locs[0x19] = in_stack_fffffffffffffca0._80_4_;
  shader_00.locs[0x1a] = in_stack_fffffffffffffca0._84_4_;
  shader_00.locs[0x1b] = in_stack_fffffffffffffca0._88_4_;
  shader_00.locs[0x1c] = in_stack_fffffffffffffca0._92_4_;
  shader_00.locs[0x1d] = in_stack_fffffffffffffca0._96_4_;
  shader_00.locs[0x1e] = in_stack_fffffffffffffca0._100_4_;
  shader_00.locs[0x1f] = in_stack_fffffffffffffca0._104_4_;
  iVar1 = rf_gfx_get_shader_location(shader_00,"roughness");
  (*(rf__ctx->field_0).gfx_ctx.gl.GenFramebuffers)(1,&fbo);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenRenderbuffers)(1,&rbo);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,fbo);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindRenderbuffer)(0x8d41,rbo);
  iVar5 = (int)size;
  (*(rf__ctx->field_0).gfx_ctx.gl.RenderbufferStorage)(0x8d41,0x81a6,iVar5,iVar5);
  (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,rbo);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,&__return_storage_ptr__->id);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,__return_storage_ptr__->id);
  iVar10 = 0;
  iVar6 = 6;
  while( true ) {
    bVar11 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar11) break;
    in_stack_fffffffffffffc98 = 0;
    in_stack_fffffffffffffc90 = 0x1406;
    in_stack_fffffffffffffc88 = 0x1907;
    (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
              (iVar10 + 0x8515,0,0x881b,iVar5,iVar5,0,0x1907,0x1406,(void *)0x0);
    iVar10 = iVar10 + 1;
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2802,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2803,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x8072,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2801,0x2703);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2800,0x2601);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenerateMipmap)(0x8513);
  rf_mat_perspective(&fbo_projection,1.5707963146269321,1.0,0.01,1000.0);
  rf_mat_look_at(fbo_views,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0x3f800000),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at(fbo_views + 1,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0xbf800000),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at(fbo_views + 2,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0x3f80000000000000),
                 (rf_vec3)(ZEXT412(0x3f800000) << 0x40));
  rf_mat_look_at(fbo_views + 3,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0xbf80000000000000),
                 (rf_vec3)(ZEXT412(0xbf800000) << 0x40));
  rf_mat_look_at(fbo_views + 4,(rf_vec3)ZEXT812(0),(rf_vec3)(ZEXT412(0x3f800000) << 0x40),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at(fbo_views + 5,(rf_vec3)ZEXT812(0),(rf_vec3)(ZEXT412(0xbf800000) << 0x40),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  uVar15 = shader.id;
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(shader.id);
  (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)(0x84c0);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,cubemap.id);
  iVar6 = shader.locs[9];
  local_258 = fbo_projection.m8;
  local_248 = fbo_projection.m12;
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(uVar15);
  buffer.v[0] = fbo_projection.m0;
  buffer.v[1] = fbo_projection.m1;
  buffer.v[2] = fbo_projection.m2;
  buffer.v[3] = fbo_projection.m3;
  buffer.v[4] = fbo_projection.m4;
  buffer.v[5] = fbo_projection.m5;
  buffer.v[6] = fbo_projection.m6;
  buffer.v[7] = fbo_projection.m7;
  buffer.v[8] = local_258;
  buffer.v[9] = fbo_projection.m9;
  buffer.v[10] = fbo_projection.m10;
  buffer.v[0xb] = fbo_projection.m11;
  buffer.v[0xc] = local_248;
  buffer.v[0xd] = fbo_projection.m13;
  buffer.v[0xe] = fbo_projection.m14;
  buffer.v[0xf] = fbo_projection.m15;
  (*(rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv)(iVar6,1,'\0',buffer.v);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,fbo);
  iVar6 = shader.locs[8];
  uVar15 = extraout_XMM0_Db;
  uVar16 = extraout_XMM0_Dc;
  uVar17 = extraout_XMM0_Dd;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    local_248 = (float)lVar2;
    local_258 = -local_248;
    uStack_254 = uVar15 ^ 0x80000000;
    uStack_250 = uVar16 ^ 0x80000000;
    uStack_24c = uVar17 ^ 0x80000000;
    uStack_244 = uVar15;
    fVar13 = exp2f(local_258);
    fVar14 = exp2f(local_258);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindRenderbuffer)(0x8d41,rbo);
    (*(rf__ctx->field_0).gfx_ctx.gl.RenderbufferStorage)
              (0x8d41,0x81a6,(int)fVar13 * iVar5,(int)fVar14 * iVar5);
    (*(rf__ctx->field_0).gfx_ctx.gl.Viewport)(0,0,(int)fVar13 * iVar5,(int)fVar14 * iVar5);
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1f)(iVar1,local_248 * 0.25);
    prVar4 = fbo_views;
    uVar15 = extraout_XMM0_Db_00;
    uVar16 = extraout_XMM0_Dc_00;
    uVar17 = extraout_XMM0_Dd_00;
    for (lVar7 = -6; lVar7 != 0; lVar7 = lVar7 + 1) {
      prVar8 = &shader;
      puVar9 = &stack0xfffffffffffffc88;
      for (lVar3 = 0x84; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar9 = (char)prVar8->id;
        prVar8 = (rf_shader *)((long)prVar8 + (ulong)bVar12 * -2 + 1);
        puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
      }
      shader_01.locs[0] = in_stack_fffffffffffffc8c;
      shader_01.id = in_stack_fffffffffffffc88;
      shader_01.locs[1] = in_stack_fffffffffffffc90;
      shader_01.locs[2] = in_stack_fffffffffffffc94;
      shader_01.locs[3] = (int)in_stack_fffffffffffffc98;
      shader_01.locs[4] = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      shader_01.locs[5] = in_stack_fffffffffffffca0._0_4_;
      shader_01.locs[6] = in_stack_fffffffffffffca0._4_4_;
      shader_01.locs[7] = in_stack_fffffffffffffca0._8_4_;
      shader_01.locs[8] = in_stack_fffffffffffffca0._12_4_;
      shader_01.locs[9] = in_stack_fffffffffffffca0._16_4_;
      shader_01.locs[10] = in_stack_fffffffffffffca0._20_4_;
      shader_01.locs[0xb] = in_stack_fffffffffffffca0._24_4_;
      shader_01.locs[0xc] = in_stack_fffffffffffffca0._28_4_;
      shader_01.locs[0xd] = in_stack_fffffffffffffca0._32_4_;
      shader_01.locs[0xe] = in_stack_fffffffffffffca0._36_4_;
      shader_01.locs[0xf] = in_stack_fffffffffffffca0._40_4_;
      shader_01.locs[0x10] = in_stack_fffffffffffffca0._44_4_;
      shader_01.locs[0x11] = in_stack_fffffffffffffca0._48_4_;
      shader_01.locs[0x12] = in_stack_fffffffffffffca0._52_4_;
      shader_01.locs[0x13] = in_stack_fffffffffffffca0._56_4_;
      shader_01.locs[0x14] = in_stack_fffffffffffffca0._60_4_;
      shader_01.locs[0x15] = in_stack_fffffffffffffca0._64_4_;
      shader_01.locs[0x16] = in_stack_fffffffffffffca0._68_4_;
      shader_01.locs[0x17] = in_stack_fffffffffffffca0._72_4_;
      shader_01.locs[0x18] = in_stack_fffffffffffffca0._76_4_;
      shader_01.locs[0x19] = in_stack_fffffffffffffca0._80_4_;
      shader_01.locs[0x1a] = in_stack_fffffffffffffca0._84_4_;
      shader_01.locs[0x1b] = in_stack_fffffffffffffca0._88_4_;
      shader_01.locs[0x1c] = in_stack_fffffffffffffca0._92_4_;
      shader_01.locs[0x1d] = in_stack_fffffffffffffca0._96_4_;
      shader_01.locs[0x1e] = in_stack_fffffffffffffca0._100_4_;
      shader_01.locs[0x1f] = in_stack_fffffffffffffca0._104_4_;
      rf_gfx_set_shader_value_matrix(shader_01,iVar6,*prVar4);
      (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferTexture2D)
                (0x8d40,0x8ce0,(int)lVar7 + 0x851b,__return_storage_ptr__->id,(int)lVar2);
      (*(rf__ctx->field_0).gfx_ctx.gl.Clear)(0x4100);
      rf_gen_draw_cube();
      prVar4 = prVar4 + 1;
      uVar15 = extraout_XMM0_Db_01;
      uVar16 = extraout_XMM0_Dc_01;
      uVar17 = extraout_XMM0_Dd_01;
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,0);
  (*(rf__ctx->field_0).gfx_ctx.gl.Viewport)
            (0,0,(rf__ctx->field_0).framebuffer_width,(rf__ctx->field_0).framebuffer_height);
  __return_storage_ptr__->width = iVar5;
  __return_storage_ptr__->height = iVar5;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_texture2d rf_gen_texture_prefilter(rf_shader shader, rf_texture2d cubemap, rf_int size)
{
    rf_texture2d prefilter = { 0 };

    // NOTE: rf_set_shader_default_locations() already setups locations for projection and view rf_mat in shader
    // Other locations should be setup externally in shader before calling the function
    // TODO: Locations should be taken out of this function... too shader dependant...
    int roughness_loc = rf_gfx_get_shader_location(shader, "roughness");

    // Setup framebuffer
    unsigned int fbo, rbo;
    rf_gl.GenFramebuffers(1, &fbo);
    rf_gl.GenRenderbuffers(1, &rbo);
    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, fbo);
    rf_gl.BindRenderbuffer(GL_RENDERBUFFER, rbo);
    rf_gl.RenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, size, size);
    rf_gl.FramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rbo);

    // Create a prefiltered HDR environment map
    rf_gl.GenTextures(1, &prefilter.id);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, prefilter.id);
    for (unsigned int i = 0; i < 6; i++)
    {
        rf_gl.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, GL_RGB16F, size, size, 0, GL_RGB, GL_FLOAT, NULL);
    }

    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

    // Generate mipmaps for the prefiltered HDR texture
    rf_gl.GenerateMipmap(GL_TEXTURE_CUBE_MAP);

    // Create rf_ctx->gl_ctx.projection (transposed) and different views for each face
    rf_mat fbo_projection = rf_mat_perspective(90.0 * RF_DEG2RAD, 1.0, 0.01, 1000.0);
    rf_mat fbo_views[6] = {
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {1.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {-1.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 1.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, 1.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, -1.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, 1.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, -1.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f})
    };

    // Prefilter HDR and store data into mipmap levels
    rf_gl.UseProgram(shader.id);
    rf_gl.ActiveTexture(GL_TEXTURE0);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, cubemap.id);
    rf_gfx_set_shader_value_matrix(shader, shader.locs[RF_LOC_MATRIX_PROJECTION], fbo_projection);

    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, fbo);

#define MAX_MIPMAP_LEVELS   5   // Max number of prefilter texture mipmaps

    for (rf_int mip = 0; mip < MAX_MIPMAP_LEVELS; mip++)
    {
        // Resize framebuffer according to mip-level size.
        unsigned int mip_width  = size*(int)powf(0.5f, (float)mip);
        unsigned int mip_height = size*(int)powf(0.5f, (float)mip);

        rf_gl.BindRenderbuffer(GL_RENDERBUFFER, rbo);
        rf_gl.RenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, mip_width, mip_height);
        rf_gl.Viewport(0, 0, mip_width, mip_height);

        float roughness = (float)mip/(float)(MAX_MIPMAP_LEVELS - 1);
        rf_gl.Uniform1f(roughness_loc, roughness);

        for (rf_int i = 0; i < 6; i++)
        {
            rf_gfx_set_shader_value_matrix(shader, shader.locs[RF_LOC_MATRIX_VIEW], fbo_views[i]);
            rf_gl.FramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, prefilter.id, mip);
            rf_gl.Clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            rf_gen_draw_cube();
        }
    }

    // Unbind framebuffer and textures
    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, 0);

    // Reset viewport dimensions to default
    rf_gl.Viewport(0, 0, rf_ctx.framebuffer_width, rf_ctx.framebuffer_height);

    prefilter.width = size;
    prefilter.height = size;
    //prefilter.mipmaps = 1 + (int)floor(log(size)/log(2));
    //prefilter.format = UNCOMPRESSED_R16G16B16;

    return prefilter;
}